

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddCircle
          (ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,float thickness)

{
  int iVar1;
  
  if (radius <= 0.0 || col < 0x1000000) {
    return;
  }
  if (num_segments < 1) {
    iVar1 = _CalcCircleAutoSegmentCount(this,radius);
LAB_0015294b:
    if (iVar1 == 0xc) {
      PathArcToFast(this,center,radius + -0.5,0,0xb);
      goto LAB_0015299e;
    }
  }
  else {
    iVar1 = 0x200;
    if ((uint)num_segments < 0x200) {
      iVar1 = num_segments;
    }
    if (2 < (uint)num_segments) goto LAB_0015294b;
    iVar1 = 3;
  }
  PathArcTo(this,center,radius + -0.5,0.0,(((float)iVar1 + -1.0) * 6.2831855) / (float)iVar1,
            iVar1 + -1);
LAB_0015299e:
  PathStroke(this,col,1,thickness);
  return;
}

Assistant:

void ImDrawList::AddCircle(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    // Obtain segment count
    if (num_segments <= 0)
    {
        // Automatic segment count
        num_segments = _CalcCircleAutoSegmentCount(radius);
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);
    }

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    if (num_segments == 12)
        PathArcToFast(center, radius - 0.5f, 0, 12 - 1);
    else
        PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, ImDrawFlags_Closed, thickness);
}